

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[16],unsigned_long,char[26],char_const*,char[25],unsigned_long,char[3],unsigned_long,char[38],char_const*,char[11],unsigned_long,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [16],unsigned_long *RestArgs,char (*RestArgs_1) [26],
               char **RestArgs_2,char (*RestArgs_3) [25],unsigned_long *RestArgs_4,
               char (*RestArgs_5) [3],unsigned_long *RestArgs_6,char (*RestArgs_7) [38],
               char **RestArgs_8,char (*RestArgs_9) [11],unsigned_long *RestArgs_10,
               char (*RestArgs_11) [2])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)(ss + 0x10));
  FormatStrSS<std::__cxx11::stringstream,char[26],char_const*,char[25],unsigned_long,char[3],unsigned_long,char[38],char_const*,char[11],unsigned_long,char[2]>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,RestArgs_7,
             RestArgs_8,RestArgs_9,RestArgs_10,RestArgs_11);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}